

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

mat44 * nifti_make_orthog_mat44
                  (mat44 *__return_storage_ptr__,float r11,float r12,float r13,float r21,float r22,
                  float r23,float r31,float r32,float r33)

{
  double dVar1;
  mat33 A;
  undefined8 in_stack_ffffffffffffff0c;
  undefined1 local_a4 [36];
  double local_80;
  double val;
  float local_70;
  mat33 P;
  mat33 Q;
  float r32_local;
  float r31_local;
  float r23_local;
  float r22_local;
  float r21_local;
  float r13_local;
  float r12_local;
  float r11_local;
  
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  local_80 = (double)(r13 * r13 + r11 * r11 + r12 * r12);
  if (local_80 <= 0.0) {
    P.m[2][1] = 1.0;
    P.m[2][2] = 0.0;
    Q.m[0][0] = 0.0;
  }
  else {
    P.m[2][1] = r11;
    P.m[2][2] = r12;
    dVar1 = sqrt(local_80);
    dVar1 = 1.0 / dVar1;
    P.m[2][1] = (float)dVar1 * P.m[2][1];
    P.m[2][2] = (float)dVar1 * P.m[2][2];
    Q.m[0][0] = (float)dVar1 * r13;
  }
  local_80 = (double)(r23 * r23 + r21 * r21 + r22 * r22);
  if (local_80 <= 0.0) {
    Q.m[0][1] = 0.0;
    Q.m[0][2] = 1.0;
    Q.m[1][0] = 0.0;
  }
  else {
    dVar1 = sqrt(local_80);
    dVar1 = 1.0 / dVar1;
    Q.m[0][1] = (float)dVar1 * r21;
    Q.m[0][2] = (float)dVar1 * r22;
    Q.m[1][0] = (float)dVar1 * r23;
  }
  local_80 = (double)(r33 * r33 + r31 * r31 + r32 * r32);
  if (local_80 <= 0.0) {
    Q.m[1][1] = P.m[2][2] * Q.m[1][0] + -(Q.m[0][0] * Q.m[0][2]);
    Q.m[1][2] = Q.m[0][0] * Q.m[0][1] + -(P.m[2][1] * Q.m[1][0]);
    Q.m[2][0] = P.m[2][1] * Q.m[0][2] + -(P.m[2][2] * Q.m[0][1]);
  }
  else {
    local_80 = sqrt(local_80);
    local_80 = 1.0 / local_80;
    Q.m[1][1] = (float)local_80 * r31;
    Q.m[1][2] = (float)local_80 * r32;
    Q.m[2][0] = (float)local_80 * r33;
  }
  A.m[0][1] = Q.m[0][1];
  A.m[0][0] = Q.m[0][0];
  A.m[1][0] = Q.m[1][0];
  A.m[0][2] = Q.m[0][2];
  A.m[1][2] = Q.m[1][2];
  A.m[1][1] = Q.m[1][1];
  A.m[2][0] = Q.m[2][0];
  A.m[2][1] = (float)(int)in_stack_ffffffffffffff0c;
  A.m[2][2] = (float)(int)((ulong)in_stack_ffffffffffffff0c >> 0x20);
  nifti_mat33_polar(A);
  memcpy((void *)((long)&val + 4),local_a4,0x24);
  __return_storage_ptr__->m[0][0] = val._4_4_;
  __return_storage_ptr__->m[0][1] = local_70;
  __return_storage_ptr__->m[0][2] = P.m[0][0];
  __return_storage_ptr__->m[1][0] = P.m[0][1];
  __return_storage_ptr__->m[1][1] = P.m[0][2];
  __return_storage_ptr__->m[1][2] = P.m[1][0];
  __return_storage_ptr__->m[2][0] = P.m[1][1];
  __return_storage_ptr__->m[2][1] = P.m[1][2];
  __return_storage_ptr__->m[2][2] = P.m[2][0];
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

mat44 nifti_make_orthog_mat44( float r11, float r12, float r13 ,
                               float r21, float r22, float r23 ,
                               float r31, float r32, float r33  )
{
   mat44 R ;
   mat33 Q , P ;
   double val ;

   R.m[3][0] = R.m[3][1] = R.m[3][2] = 0.0l ; R.m[3][3] = 1.0l ;

   Q.m[0][0] = r11 ; Q.m[0][1] = r12 ; Q.m[0][2] = r13 ; /* load Q */
   Q.m[1][0] = r21 ; Q.m[1][1] = r22 ; Q.m[1][2] = r23 ;
   Q.m[2][0] = r31 ; Q.m[2][1] = r32 ; Q.m[2][2] = r33 ;

   /* normalize row 1 */

   val = Q.m[0][0]*Q.m[0][0] + Q.m[0][1]*Q.m[0][1] + Q.m[0][2]*Q.m[0][2] ;
   if( val > 0.0l ){
     val = 1.0l / sqrt(val) ;
     Q.m[0][0] *= (float)val ; Q.m[0][1] *= (float)val ; Q.m[0][2] *= (float)val ;
   } else {
     Q.m[0][0] = 1.0l ; Q.m[0][1] = 0.0l ; Q.m[0][2] = 0.0l ;
   }

   /* normalize row 2 */

   val = Q.m[1][0]*Q.m[1][0] + Q.m[1][1]*Q.m[1][1] + Q.m[1][2]*Q.m[1][2] ;
   if( val > 0.0l ){
     val = 1.0l / sqrt(val) ;
     Q.m[1][0] *= (float)val ; Q.m[1][1] *= (float)val ; Q.m[1][2] *= (float)val ;
   } else {
     Q.m[1][0] = 0.0l ; Q.m[1][1] = 1.0l ; Q.m[1][2] = 0.0l ;
   }

   /* normalize row 3 */

   val = Q.m[2][0]*Q.m[2][0] + Q.m[2][1]*Q.m[2][1] + Q.m[2][2]*Q.m[2][2] ;
   if( val > 0.0l ){
     val = 1.0l / sqrt(val) ;
     Q.m[2][0] *= (float)val ; Q.m[2][1] *= (float)val ; Q.m[2][2] *= (float)val ;
   } else {
     Q.m[2][0] = Q.m[0][1]*Q.m[1][2] - Q.m[0][2]*Q.m[1][1] ;  /* cross */
     Q.m[2][1] = Q.m[0][2]*Q.m[1][0] - Q.m[0][0]*Q.m[1][2] ;  /* product */
     Q.m[2][2] = Q.m[0][0]*Q.m[1][1] - Q.m[0][1]*Q.m[1][0] ;
   }

   P = nifti_mat33_polar(Q) ;  /* P is orthog matrix closest to Q */

   R.m[0][0] = P.m[0][0] ; R.m[0][1] = P.m[0][1] ; R.m[0][2] = P.m[0][2] ;
   R.m[1][0] = P.m[1][0] ; R.m[1][1] = P.m[1][1] ; R.m[1][2] = P.m[1][2] ;
   R.m[2][0] = P.m[2][0] ; R.m[2][1] = P.m[2][1] ; R.m[2][2] = P.m[2][2] ;

   R.m[0][3] = R.m[1][3] = R.m[2][3] = 0.0f ; return R ;
}